

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  size_t this_00;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmExportSet *pcVar5;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar6;
  string *psVar7;
  cmMakefile *this_01;
  char *pcVar8;
  ostream *poVar9;
  reference ppcVar10;
  reference config;
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar11;
  bool local_6a5;
  bool local_669;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_578;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_570;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_568;
  const_iterator ci;
  undefined1 local_558 [7];
  bool result;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  bool local_4e2;
  allocator local_4e1;
  undefined1 local_4e0 [6];
  bool newCMP0022Behavior;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  undefined1 local_420 [8];
  ImportPropertyMap properties;
  cmTarget *te_1;
  __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_3e0;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_3d8;
  const_iterator tei_1;
  undefined1 local_3c8 [4];
  bool requiresConfigFiles;
  bool require3_1_0;
  bool require3_0_0;
  bool require2_8_12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  undefined1 local_390 [8];
  string dest;
  string absDestS;
  undefined1 local_330 [8];
  string absDest;
  string *expDest;
  string local_300;
  undefined1 local_2e0 [8];
  string installPrefix;
  string local_2b8 [32];
  undefined1 local_298 [8];
  ostringstream e;
  cmTargetExport *local_100;
  cmTargetExport *te;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_98 [3];
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_80;
  const_iterator tei;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tei);
  pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  pvVar6 = cmExportSet::GetTargetExports(pcVar5);
  local_80._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar6);
  while( true ) {
    pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
    pvVar6 = cmExportSet::GetTargetExports(pcVar5);
    local_98[0]._M_current =
         (cmTargetExport **)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar6);
    bVar1 = __gnu_cxx::operator!=(&local_80,local_98);
    if (!bVar1) break;
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tei,
                   &(this->super_cmExportFileGenerator).Namespace);
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_80);
    cmTarget::GetExportName_abi_cxx11_((string *)&te,(*ppcVar10)->Target);
    std::operator+(&local_b8,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&te);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&te);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::operator=((string *)&tei," ");
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_80);
    local_100 = *ppcVar10;
    pVar11 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                       (&(this->super_cmExportFileGenerator).ExportedTargets,&local_100->Target);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar9 = std::operator<<((ostream *)local_298,"install(EXPORT \"");
      pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
      psVar7 = cmExportSet::GetName_abi_cxx11_(pcVar5);
      poVar9 = std::operator<<(poVar9,(string *)psVar7);
      poVar9 = std::operator<<(poVar9,"\" ...) ");
      poVar9 = std::operator<<(poVar9,"includes target \"");
      psVar7 = cmTarget::GetName_abi_cxx11_(local_100->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar7);
      std::operator<<(poVar9,"\" more than once in the export set.");
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar8,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2b8);
      this_local._7_1_ = 0;
      installPrefix.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      goto LAB_0072e359;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
              ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
               ((long)&expectedTargets.field_2 + 8),&local_100);
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_80);
  }
  cmExportFileGenerator::GenerateExpectedTargetsCode
            (&this->super_cmExportFileGenerator,os,(string *)((long)&sep.field_2 + 8));
  installPrefix.field_2._12_4_ = 0;
LAB_0072e359:
  std::__cxx11::string::~string((string *)&tei);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (installPrefix.field_2._12_4_ != 0) goto LAB_0072f36a;
  this_01 = cmInstallExportGenerator::GetMakefile(this->IEGen);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_300,"CMAKE_INSTALL_PREFIX",(allocator *)((long)&expDest + 7));
  pcVar8 = cmMakefile::GetSafeDefinition(this_01,&local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_2e0,pcVar8,(allocator *)((long)&expDest + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&expDest + 6));
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)((long)&expDest + 7));
  absDest.field_2._8_8_ = cmInstallExportGenerator::GetDestination_abi_cxx11_(this->IEGen);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)absDest.field_2._8_8_);
  if (bVar1) {
    poVar9 = std::operator<<(os,
                             "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                            );
    poVar9 = std::operator<<(poVar9,(string *)local_2e0);
    std::operator<<(poVar9,"\")\n\n");
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&absDestS.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                   "/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&absDestS.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   absDest.field_2._8_8_);
    std::__cxx11::string::~string((string *)(absDestS.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dest.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   "/");
    poVar9 = std::operator<<(os,"# Compute the installation prefix relative to this file.\n");
    poVar9 = std::operator<<(poVar9,"get_filename_component(_IMPORT_PREFIX");
    std::operator<<(poVar9," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmHasLiteralPrefix<char_const*,6ul>(pcVar8,(char (*) [6])0x979d41);
    if (bVar1) {
LAB_0072e6d7:
      poVar9 = std::operator<<(os,
                               "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                              );
      poVar9 = std::operator<<(poVar9,(string *)local_330);
      poVar9 = std::operator<<(poVar9,
                               "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                              );
      poVar9 = std::operator<<(poVar9,(string *)local_330);
      std::operator<<(poVar9,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
    }
    else {
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmHasLiteralPrefix<char_const*,8ul>(pcVar8,(char (*) [8])0x979d4b);
      if (bVar1) goto LAB_0072e6d7;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmHasLiteralPrefix<char_const*,10ul>(pcVar8,(char (*) [10])"/usr/lib/");
      if (bVar1) goto LAB_0072e6d7;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmHasLiteralPrefix<char_const*,12ul>(pcVar8,(char (*) [12])"/usr/lib64/");
      if (bVar1) goto LAB_0072e6d7;
    }
    std::__cxx11::string::string((string *)local_390,(string *)absDest.field_2._8_8_);
    while (bVar2 = std::__cxx11::string::empty(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::operator<<(os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n");
      cmsys::SystemTools::GetFilenamePath
                ((string *)
                 &missingTargets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_390);
      std::__cxx11::string::operator=
                ((string *)local_390,
                 (string *)
                 &missingTargets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &missingTargets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::operator<<(os,"\n");
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)(dest.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3c8);
  tei_1._M_current._7_1_ = 0;
  tei_1._M_current._6_1_ = 0;
  tei_1._M_current._5_1_ = 0;
  tei_1._M_current._4_1_ = 0;
  local_3e0._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin
                 ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                  ((long)&expectedTargets.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
  ::__normal_iterator<cmTargetExport**>
            ((__normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
              *)&local_3d8,&local_3e0);
  while( true ) {
    te_1 = (cmTarget *)
           std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end
                     ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                      ((long)&expectedTargets.field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_3d8,
                       (__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                        *)&te_1);
    if (!bVar1) break;
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_3d8);
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(*ppcVar10)->Target;
    local_669 = true;
    if ((tei_1._M_current._4_1_ & 1) == 0) {
      TVar3 = cmTarget::GetType((cmTarget *)
                                properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_669 = TVar3 != INTERFACE_LIBRARY;
    }
    tei_1._M_current._4_1_ = local_669;
    cmExportFileGenerator::GenerateImportTargetCode
              (&this->super_cmExportFileGenerator,os,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_420);
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_3d8);
    cmExportFileGenerator::PopulateIncludeDirectoriesInterface
              (&this->super_cmExportFileGenerator,*ppcVar10,InstallInterface,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_3d8);
    cmExportFileGenerator::PopulateSourcesInterface
              (&this->super_cmExportFileGenerator,*ppcVar10,InstallInterface,
               (ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_440,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_441);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&local_440,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               InstallInterface,(ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"INTERFACE_COMPILE_DEFINITIONS",&local_469);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&local_468,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               InstallInterface,(ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"INTERFACE_COMPILE_OPTIONS",&local_491);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&local_490,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               InstallInterface,(ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b8,"INTERFACE_AUTOUIC_OPTIONS",&local_4b9);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&local_4b8,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               InstallInterface,(ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_4e0,"INTERFACE_COMPILE_FEATURES",&local_4e1);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,(string *)local_4e0,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               InstallInterface,(ImportPropertyMap *)local_420,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8);
    std::__cxx11::string::~string((string *)local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    PVar4 = cmTarget::GetPolicyStatusCMP0022
                      ((cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_6a5 = false;
    if (PVar4 != WARN) {
      PVar4 = cmTarget::GetPolicyStatusCMP0022
                        ((cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_6a5 = PVar4 != OLD;
    }
    local_4e2 = local_6a5;
    if (((local_6a5 != false) &&
        (bVar1 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                           (&this->super_cmExportFileGenerator,
                            (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            InstallInterface,(ImportPropertyMap *)local_420,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_3c8), bVar1)) &&
       (((this->super_cmExportFileGenerator).ExportOld & 1U) == 0)) {
      tei_1._M_current._7_1_ = 1;
    }
    TVar3 = cmTarget::GetType((cmTarget *)
                              properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = properties._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (TVar3 == INTERFACE_LIBRARY) {
      tei_1._M_current._6_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"INTERFACE_SOURCES",&local_509);
    pcVar8 = cmTarget::GetProperty((cmTarget *)this_00,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    if (pcVar8 != (char *)0x0) {
      tei_1._M_current._5_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_530,"INTERFACE_POSITION_INDEPENDENT_CODE",&local_531);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&local_530,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ImportPropertyMap *)local_420);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    cmExportFileGenerator::PopulateCompatibleInterfaceProperties
              (&this->super_cmExportFileGenerator,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ImportPropertyMap *)local_420);
    cmExportFileGenerator::GenerateInterfaceProperties
              (&this->super_cmExportFileGenerator,
               (cmTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,
               (ImportPropertyMap *)local_420);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_420);
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_3d8);
  }
  if ((tei_1._M_current._5_1_ & 1) == 0) {
    if ((tei_1._M_current._6_1_ & 1) == 0) {
      if ((tei_1._M_current._7_1_ & 1) != 0) {
        cmExportFileGenerator::GenerateRequiredCMakeVersion
                  (&this->super_cmExportFileGenerator,os,"2.8.12");
      }
    }
    else {
      cmExportFileGenerator::GenerateRequiredCMakeVersion
                (&this->super_cmExportFileGenerator,os,"3.0.0");
    }
  }
  else {
    cmExportFileGenerator::GenerateRequiredCMakeVersion
              (&this->super_cmExportFileGenerator,os,"3.1.0");
  }
  poVar9 = std::operator<<(os,"# Load information for each installed configuration.\n");
  poVar9 = std::operator<<(poVar9,
                           "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  poVar9 = std::operator<<(poVar9,"file(GLOB CONFIG_FILES \"${_DIR}/");
  GetConfigImportFileGlob_abi_cxx11_((string *)local_558,this);
  poVar9 = std::operator<<(poVar9,(string *)local_558);
  poVar9 = std::operator<<(poVar9,"\")\n");
  poVar9 = std::operator<<(poVar9,"foreach(f ${CONFIG_FILES})\n");
  poVar9 = std::operator<<(poVar9,"  include(${f})\n");
  poVar9 = std::operator<<(poVar9,"endforeach()\n");
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)local_558);
  poVar9 = std::operator<<(os,"# Cleanup temporary variables.\n");
  poVar9 = std::operator<<(poVar9,"set(_IMPORT_PREFIX)\n");
  std::operator<<(poVar9,"\n");
  cmExportFileGenerator::GenerateImportedFileCheckLoop(&this->super_cmExportFileGenerator,os);
  ci._M_current._7_1_ = 1;
  if ((tei_1._M_current._4_1_ & 1) != 0) {
    local_570._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&(this->super_cmExportFileGenerator).Configurations);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_568,&local_570);
    while( true ) {
      local_578._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(this->super_cmExportFileGenerator).Configurations);
      bVar1 = __gnu_cxx::operator!=(&local_568,&local_578);
      if (!bVar1) break;
      config = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_568);
      bVar1 = GenerateImportFileConfig
                        (this,config,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3c8);
      if (!bVar1) {
        ci._M_current._7_1_ = 0;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_568);
    }
  }
  cmExportFileGenerator::GenerateMissingTargetsCheckCode
            (&this->super_cmExportFileGenerator,os,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8);
  this_local._7_1_ = ci._M_current._7_1_ & 1;
  installPrefix.field_2._12_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  std::__cxx11::string::~string((string *)local_2e0);
LAB_0072f36a:
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets += sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmTarget* te = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || te->GetType() != cmTarget::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, te);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
                              te->GetPolicyStatusCMP0022() != cmPolicies::WARN
                           && te->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(te,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (te->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(te->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  te, properties);
    this->PopulateCompatibleInterfaceProperties(te, properties);

    this->GenerateInterfaceProperties(te, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}